

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

size_t __thiscall ot::commissioner::coap::Message::GetHeaderLength(Message *this)

{
  pointer puVar1;
  pointer puVar2;
  Message *in_RSI;
  ByteArray buf;
  Error error;
  ByteArray local_58;
  Error local_38;
  
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Serialize(&local_38,in_RSI,&this->mHeader,&local_58);
  puVar2 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar1 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_38.mCode == kNone) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.mMessage._M_dataplus._M_p != &local_38.mMessage.field_2) {
      operator_delete(local_38.mMessage._M_dataplus._M_p);
    }
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return (long)puVar2 - (long)puVar1;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp"
                ,0xb9,"size_t ot::commissioner::coap::Message::GetHeaderLength() const");
}

Assistant:

size_t Message::GetHeaderLength() const
{
    ByteArray buf;
    Error     error = Serialize(mHeader, buf);

    ASSERT(error == ErrorCode::kNone);
    return buf.size();
}